

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopCreateOr(Mem_Flex_t *pMan,int nVars,int *pfCompl)

{
  char *pcVar1;
  char local_30;
  int local_2c;
  int i;
  char *pSop;
  int *pfCompl_local;
  int nVars_local;
  Mem_Flex_t *pMan_local;
  
  pcVar1 = Abc_SopStart(pMan,1,nVars);
  for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
    if (pfCompl == (int *)0x0) {
      local_30 = '\0';
    }
    else {
      local_30 = (char)pfCompl[local_2c];
    }
    pcVar1[local_2c] = local_30 + '0';
  }
  pcVar1[nVars + 1] = '0';
  return pcVar1;
}

Assistant:

char * Abc_SopCreateOr( Mem_Flex_t * pMan, int nVars, int * pfCompl )
{
    char * pSop;
    int i;
    pSop = Abc_SopStart( pMan, 1, nVars );
    for ( i = 0; i < nVars; i++ )
        pSop[i] = '0' + (pfCompl? pfCompl[i] : 0);
    pSop[nVars + 1] = '0';
    return pSop;
}